

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void expr_toreg(FuncState *fs,ExpDesc *e,BCReg reg)

{
  BCPos vtarget;
  int iVar1;
  BCPos BVar2;
  BCPos dtarget;
  BCPos dtarget_00;
  
  expr_toreg_nobranch(fs,e,reg);
  if (e->k == VJMP) {
    jmp_append(fs,&e->t,(e->u).s.info);
  }
  BVar2 = e->f;
  if (e->t == BVar2) goto LAB_0011aaf6;
  iVar1 = jmp_novalue(fs,e->t);
  if (iVar1 == 0) {
    iVar1 = jmp_novalue(fs,BVar2);
    if (iVar1 != 0) goto LAB_0011aa51;
    dtarget_00 = 0xffffffff;
    dtarget = 0xffffffff;
  }
  else {
LAB_0011aa51:
    BVar2 = 0xffffffff;
    if (e->k != VJMP) {
      BVar2 = bcemit_jmp(fs);
    }
    dtarget = bcemit_INS(fs,reg << 8 | 0x10029);
    bcemit_INS(fs,fs->freereg << 8 | 0x80010054);
    dtarget_00 = bcemit_INS(fs,reg << 8 | 0x20029);
    fs->lasttarget = fs->pc;
    jmp_append(fs,&fs->jpc,BVar2);
    BVar2 = e->f;
  }
  vtarget = fs->pc;
  fs->lasttarget = vtarget;
  jmp_patchval(fs,BVar2,vtarget,reg,dtarget);
  jmp_patchval(fs,e->t,vtarget,reg,dtarget_00);
LAB_0011aaf6:
  e->f = 0xffffffff;
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  e->t = 0xffffffff;
  return;
}

Assistant:

static void expr_toreg(FuncState *fs, ExpDesc *e, BCReg reg)
{
  expr_toreg_nobranch(fs, e, reg);
  if (e->k == VJMP)
    jmp_append(fs, &e->t, e->u.s.info);  /* Add it to the true jump list. */
  if (expr_hasjump(e)) {  /* Discharge expression with branches. */
    BCPos jend, jfalse = NO_JMP, jtrue = NO_JMP;
    if (jmp_novalue(fs, e->t) || jmp_novalue(fs, e->f)) {
      BCPos jval = (e->k == VJMP) ? NO_JMP : bcemit_jmp(fs);
      jfalse = bcemit_AD(fs, BC_KPRI, reg, VKFALSE);
      bcemit_AJ(fs, BC_JMP, fs->freereg, 1);
      jtrue = bcemit_AD(fs, BC_KPRI, reg, VKTRUE);
      jmp_tohere(fs, jval);
    }
    jend = fs->pc;
    fs->lasttarget = jend;
    jmp_patchval(fs, e->f, jend, reg, jfalse);
    jmp_patchval(fs, e->t, jend, reg, jtrue);
  }
  e->f = e->t = NO_JMP;
  e->u.s.info = reg;
  e->k = VNONRELOC;
}